

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O2

bool __thiscall
cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
iterator::operator!=(iterator *this,iterator other)

{
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcVar1;
  uint __line;
  bool bVar2;
  char *__assertion;
  
  pcVar1 = this->Tree;
  if (pcVar1 == (cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    __assertion = "this->Tree";
    __line = 0x70;
  }
  else {
    if ((long)(pcVar1->UpPositions).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pcVar1->UpPositions).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 ==
        (long)(pcVar1->Data).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pcVar1->Data).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5) {
      bVar2 = operator==(this,other);
      return !bVar2;
    }
    __assertion = "this->Tree->UpPositions.size() == this->Tree->Data.size()";
    __line = 0x71;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmLinkedTree.h"
                ,__line,
                "bool cmLinkedTree<std::basic_string<char>>::iterator::operator!=(iterator) const [T = std::basic_string<char>]"
               );
}

Assistant:

bool operator!=(iterator other) const
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      return !(*this == other);
    }